

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poc-fec.c
# Opt level: O3

int poc_encoder(int sock,sockaddr_in *saddr,char *filename)

{
  mp3_frame_t *pmVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  unsigned_short uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  fec_t *fec;
  adu_t *paVar9;
  ulong uVar10;
  unsigned_long uVar11;
  ssize_t sVar12;
  int *piVar13;
  uchar uVar14;
  uint uVar15;
  uint uVar16;
  gf **src;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  gf *pgVar20;
  gf *__dest;
  ulong uVar21;
  ulong uVar22;
  gf agStack_5fb0 [8];
  gf agStack_5fa8 [8];
  unsigned_long uStack_5fa0;
  ulong uStack_5f98;
  long lStack_5f90;
  gf *pgStack_5f88;
  undefined1 local_5f80 [8];
  mp3_frame_t mp3_frame;
  aq_t adu_queue;
  file_t mp3_file;
  timeval tv;
  ulong local_98;
  ulong local_90;
  unsigned_long local_80;
  ulong local_58;
  uint local_34;
  
  lStack_5f90 = 0x106db8;
  iVar6 = file_open_read((file_t *)&adu_queue.size,filename);
  if (iVar6 == 0) {
    iVar6 = 0;
    lStack_5f90 = 0x10746b;
    fprintf(_stderr,"Could not open mp3 file: %s\n",filename);
  }
  else {
    lStack_5f90 = 0x106dd3;
    fec = fec_new((uint)fec_k,(uint)fec_n);
    lStack_5f90 = 0x106de3;
    aq_init((aq_t *)(mp3_frame.raw + 0xf98));
    lVar3 = -(ulong)((uint)fec_k * 8 + 0xf & 0xfffffff0);
    lVar4 = lVar3 + -0x5f88;
    *(undefined8 *)((long)&lStack_5f90 + lVar3) = 0x106e15;
    gettimeofday((timeval *)&mp3_file.pos,(__timezone_ptr_t)0x0);
    local_80 = mp3_file.pos;
    *(undefined8 *)((long)&lStack_5f90 + lVar3) = 0x106e37;
    iVar7 = mp3_next_frame((file_t *)&adu_queue.size,(mp3_frame_t *)local_5f80);
    iVar6 = 1;
    if ((0 < iVar7) && ((finished & 1) == 0)) {
      local_34 = 0;
      local_58 = 0;
      local_98 = 0;
      do {
        *(undefined8 *)((long)&lStack_5f90 + lVar3) = 0x106e8f;
        iVar6 = aq_add_frame((aq_t *)(mp3_frame.raw + 0xf98),(mp3_frame_t *)local_5f80);
        if (0 < iVar6) {
          *(undefined8 *)((long)&lStack_5f90 + lVar3) = 0x106e9f;
          paVar9 = aq_get_adu((aq_t *)(mp3_frame.raw + 0xf98));
          *(adu_t **)((long)&pgStack_5f88 + (ulong)local_34 * 8 + lVar4 + 0x5f88) = paVar9;
          if (paVar9 == (adu_t *)0x0) {
            *(undefined8 *)((long)&lStack_5f90 + lVar3) = 0x10748c;
            __assert_fail("in_adus[cnt] != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/poc-fec.c",
                          0x68,"int poc_encoder(int, struct sockaddr_in *, char *)");
          }
          local_34 = local_34 + 1;
          if (local_34 == fec_k) {
            if (fec_k == '\0') {
              uVar15 = 0;
              local_90 = 0;
              uVar18 = 0;
            }
            else {
              uVar17 = 0;
              local_90 = 0;
              uVar10 = 0;
              do {
                pmVar1 = *(mp3_frame_t **)((long)&pgStack_5f88 + uVar17 * 8 + lVar4 + 0x5f88);
                *(undefined8 *)((long)&lStack_5f90 + lVar3) = 0x106ee1;
                uVar11 = mp3_frame_size(pmVar1);
                uVar18 = uVar11 & 0xffffffff;
                if ((uint)uVar11 < (uint)uVar10) {
                  uVar18 = uVar10;
                }
                local_90 = local_90 + pmVar1->usec;
                uVar17 = uVar17 + 1;
                uVar15 = (uint)fec_k;
                uVar10 = uVar18;
              } while (uVar17 < uVar15);
              if (0xfff0 < (uint)uVar18) {
                *(code **)((long)&lStack_5f90 + lVar3) = main;
                __assert_fail("max_len < FEC_PKT_PAYLOAD_SIZE",
                              "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/poc-fec.c"
                              ,0x7b,"int poc_encoder(int, struct sockaddr_in *, char *)");
              }
              local_58 = local_58 + local_90;
            }
            src = (gf **)((long)&pgStack_5f88 +
                         (lVar4 - (ulong)(uVar15 * 8 + 0xf & 0xfffffff0)) + 0x5f88);
            uVar15 = (uint)uVar18;
            pgVar20 = (gf *)((long)src - ((ulong)(uVar15 * fec_k) + 0xf & 0xfffffffffffffff0));
            if (fec_k == 0) {
              uVar10 = 0;
              uVar17 = 0;
            }
            else {
              uVar21 = 0;
              uVar17 = 0;
              __dest = pgVar20;
              do {
                pmVar1 = *(mp3_frame_t **)((long)&pgStack_5f88 + uVar21 * 8 + lVar4 + 0x5f88);
                pgVar20[-8] = 0x89;
                pgVar20[-7] = 'o';
                pgVar20[-6] = '\x10';
                pgVar20[-5] = '\0';
                pgVar20[-4] = '\0';
                pgVar20[-3] = '\0';
                pgVar20[-2] = '\0';
                pgVar20[-1] = '\0';
                uVar11 = mp3_frame_size(pmVar1);
                src[uVar21] = __dest;
                pgVar20[-8] = 0xb0;
                pgVar20[-7] = 'o';
                pgVar20[-6] = '\x10';
                pgVar20[-5] = '\0';
                pgVar20[-4] = '\0';
                pgVar20[-3] = '\0';
                pgVar20[-2] = '\0';
                pgVar20[-1] = '\0';
                memcpy(__dest,pmVar1->raw,uVar11 & 0xffffffff);
                uVar16 = uVar15 - (uint)uVar11;
                if ((uint)uVar11 <= uVar15 && uVar16 != 0) {
                  pgVar20[-8] = 0xc5;
                  pgVar20[-7] = 'o';
                  pgVar20[-6] = '\x10';
                  pgVar20[-5] = '\0';
                  pgVar20[-4] = '\0';
                  pgVar20[-3] = '\0';
                  pgVar20[-2] = '\0';
                  pgVar20[-1] = '\0';
                  memset(__dest + (uVar11 & 0xffffffff),0,(ulong)uVar16);
                }
                uVar17 = uVar17 + pmVar1->bitrate;
                __dest = __dest + uVar18;
                uVar21 = uVar21 + 1;
                uVar10 = (ulong)fec_k;
              } while (uVar21 < uVar10);
            }
            uVar21 = (ulong)fec_n;
            uVar14 = (uchar)uVar10;
            if (fec_n != '\0') {
              uVar22 = 0;
              do {
                pkt.hdr.packet_seq = (uchar)uVar22;
                pkt.hdr.fec_k = fec_k;
                pkt.hdr.fec_n = (uchar)uVar21;
                pkt.hdr.group_tstamp = local_58;
                pgVar20[-8] = 0x9e;
                pgVar20[-7] = 'p';
                pgVar20[-6] = '\x10';
                pgVar20[-5] = '\0';
                pgVar20[-4] = '\0';
                pgVar20[-3] = '\0';
                pgVar20[-2] = '\0';
                pgVar20[-1] = '\0';
                pkt.hdr.fec_len = (unsigned_short)uVar18 + 2;
                fec_encode(fec,src,pkt.payload,(uint)uVar22,uVar15);
                uVar5 = (unsigned_short)uVar18;
                if (uVar22 < fec_k) {
                  pmVar1 = *(mp3_frame_t **)((long)&pgStack_5f88 + uVar22 * 8 + lVar4 + 0x5f88);
                  pgVar20[-8] = 0xba;
                  pgVar20[-7] = 'p';
                  pgVar20[-6] = '\x10';
                  pgVar20[-5] = '\0';
                  pgVar20[-4] = '\0';
                  pgVar20[-3] = '\0';
                  pgVar20[-2] = '\0';
                  pgVar20[-1] = '\0';
                  uVar11 = mp3_frame_size(pmVar1);
                  uVar5 = (unsigned_short)uVar11;
                }
                pgVar20[-8] = 0xdc;
                pgVar20[-7] = 'p';
                pgVar20[-6] = '\x10';
                pgVar20[-5] = '\0';
                pgVar20[-4] = '\0';
                pgVar20[-3] = '\0';
                pgVar20[-2] = '\0';
                pgVar20[-1] = '\0';
                pkt.hdr.len = uVar5;
                sVar12 = fec_pkt_sendto(&pkt,sock,(sockaddr *)saddr,0x10);
                if (sVar12 < 0) {
                  pgVar20[-8] = 0xce;
                  pgVar20[-7] = 'q';
                  pgVar20[-6] = '\x10';
                  pgVar20[-5] = '\0';
                  pgVar20[-4] = '\0';
                  pgVar20[-3] = '\0';
                  pgVar20[-2] = '\0';
                  pgVar20[-1] = '\0';
                  piVar13 = __errno_location();
                  if (*piVar13 != 0x69) {
                    pgVar20[-8] = 0xec;
                    pgVar20[-7] = 's';
                    pgVar20[-6] = '\x10';
                    pgVar20[-5] = '\0';
                    pgVar20[-4] = '\0';
                    pgVar20[-3] = '\0';
                    pgVar20[-2] = '\0';
                    pgVar20[-1] = '\0';
                    perror("Error while sending packet");
                    iVar6 = 0;
                    goto LAB_001073f6;
                  }
                  pgVar20[-8] = 0xdc;
                  pgVar20[-7] = 'q';
                  pgVar20[-6] = '\x10';
                  pgVar20[-5] = '\0';
                  pgVar20[-4] = '\0';
                  pgVar20[-3] = '\0';
                  pgVar20[-2] = '\0';
                  pgVar20[-1] = '\0';
                  poc_encoder_cold_1();
                }
                uVar21 = (ulong)fec_n;
                poc_encoder::wait_time = poc_encoder::wait_time + local_90 / uVar21;
                if (1000 < poc_encoder::wait_time) {
                  builtin_memcpy(pgVar20 + -8,"\x1aq\x10",4);
                  pgVar20[-4] = '\0';
                  pgVar20[-3] = '\0';
                  pgVar20[-2] = '\0';
                  pgVar20[-1] = '\0';
                  usleep((__useconds_t)poc_encoder::wait_time);
                }
                local_98 = local_98 + local_90 / uVar21;
                if ((quiet == 0) &&
                   (uVar16 = poc_encoder::count + 1, uVar8 = poc_encoder::count * -0x33333333,
                   poc_encoder::count = uVar16,
                   (uVar8 >> 1 | (uint)((uVar8 & 1) != 0) << 0x1f) < 0x1999999a)) {
                  uVar21 = (local_98 / 1000000) % 0x3c;
                  if (mp3_file.offset == 0) {
                    pgVar20[-8] = 0xf9;
                    pgVar20[-7] = 'q';
                    pgVar20[-6] = '\x10';
                    pgVar20[-5] = '\0';
                    pgVar20[-4] = '\0';
                    pgVar20[-3] = '\0';
                    pgVar20[-2] = '\0';
                    pgVar20[-1] = '\0';
                    fprintf(_stdout,"\r%02ld:%02ld %ld %3ldkbit/s ",local_98 / 60000000,uVar21,
                            mp3_file._0_8_,uVar17 / uVar10);
                  }
                  else {
                    lVar19 = (long)(((float)(local_58 / 1000) / ((float)(ulong)mp3_file._0_8_ + 1.0)
                                    ) * (float)mp3_file.offset);
                    *(long *)(pgVar20 + -8) =
                         (long)(((float)(ulong)mp3_file._0_8_ * 100.0) / (float)mp3_file.offset);
                    *(ulong *)(pgVar20 + -0x10) = uVar17 / uVar10;
                    *(unsigned_long *)(pgVar20 + -0x18) = mp3_file.offset;
                    *(undefined8 *)(pgVar20 + -0x20) = mp3_file._0_8_;
                    pgVar20[-0x28] = 0xe8;
                    pgVar20[-0x27] = 'r';
                    pgVar20[-0x26] = '\x10';
                    pgVar20[-0x25] = '\0';
                    pgVar20[-0x24] = '\0';
                    pgVar20[-0x23] = '\0';
                    pgVar20[-0x22] = '\0';
                    pgVar20[-0x21] = '\0';
                    fprintf(_stdout,"\r%02ld:%02ld/%02ld:%02ld %7ld/%7ld %3ldkbit/s (%3ld%%) ",
                            local_98 / 60000000,uVar21,lVar19 / 60000,(lVar19 / 1000) % 0x3c);
                  }
                  pgVar20[-8] = 0xff;
                  pgVar20[-7] = 'r';
                  pgVar20[-6] = '\x10';
                  pgVar20[-5] = '\0';
                  pgVar20[-4] = '\0';
                  pgVar20[-3] = '\0';
                  pgVar20[-2] = '\0';
                  pgVar20[-1] = '\0';
                  fflush(_stdout);
                }
                builtin_memcpy(pgVar20 + -8,"\rs\x10",4);
                pgVar20[-4] = '\0';
                pgVar20[-3] = '\0';
                pgVar20[-2] = '\0';
                pgVar20[-1] = '\0';
                gettimeofday((timeval *)&mp3_file.pos,(__timezone_ptr_t)0x0);
                poc_encoder::wait_time =
                     (mp3_file.pos - local_80) * -1000000 + poc_encoder::wait_time;
                uVar8 = (uint)poc_encoder::wait_time;
                uVar16 = -uVar8;
                if (0 < (int)uVar8) {
                  uVar16 = uVar8;
                }
                if (1000000 < uVar16) {
                  poc_encoder::wait_time = 0;
                }
                uVar22 = uVar22 + 1;
                uVar21 = (ulong)fec_n;
                local_80 = mp3_file.pos;
              } while (uVar22 < uVar21);
              uVar14 = fec_k;
            }
            pkt.hdr.group_seq = pkt.hdr.group_seq + '\x01';
            if (uVar14 != '\0') {
              uVar18 = 0;
              do {
                pvVar2 = *(void **)((long)&pgStack_5f88 + uVar18 * 8 + lVar4 + 0x5f88);
                pgVar20[-8] = 0xa3;
                pgVar20[-7] = 's';
                pgVar20[-6] = '\x10';
                pgVar20[-5] = '\0';
                pgVar20[-4] = '\0';
                pgVar20[-3] = '\0';
                pgVar20[-2] = '\0';
                pgVar20[-1] = '\0';
                free(pvVar2);
                uVar18 = uVar18 + 1;
              } while (uVar18 < fec_k);
            }
            local_34 = 0;
          }
        }
        *(undefined8 *)((long)&lStack_5f90 + lVar3) = 0x1073c8;
        iVar7 = mp3_next_frame((file_t *)&adu_queue.size,(mp3_frame_t *)local_5f80);
        iVar6 = 1;
      } while ((0 < iVar7) && ((finished & 1) == 0));
LAB_001073f6:
      if (local_34 != 0) {
        uVar18 = 0;
        do {
          pvVar2 = *(void **)((long)&pgStack_5f88 + uVar18 * 8 + lVar4 + 0x5f88);
          *(undefined8 *)((long)&lStack_5f90 + lVar3) = 0x10740d;
          free(pvVar2);
          uVar18 = uVar18 + 1;
        } while (local_34 != uVar18);
      }
    }
    *(undefined8 *)((long)&lStack_5f90 + lVar3) = 0x107421;
    aq_destroy((aq_t *)(mp3_frame.raw + 0xf98));
    *(undefined8 *)((long)&lStack_5f90 + lVar3) = 0x10742a;
    fec_free(fec);
    *(undefined8 *)((long)&lStack_5f90 + lVar3) = 0x107436;
    file_close((file_t *)&adu_queue.size);
  }
  return iVar6;
}

Assistant:

int poc_encoder(int sock, struct sockaddr_in *saddr, char *filename) {
  int retval = 1;
  
  /*M
    Open file for reading.
  **/
  file_t mp3_file;
  if (!file_open_read(&mp3_file, filename)) {
    fprintf(stderr, "Could not open mp3 file: %s\n", filename);
    return 0;
  }

  /*M
    Initialize the FEC parameters.
  **/
  fec_t *fec = fec_new(fec_k, fec_n);

  aq_t adu_queue;
  aq_init(&adu_queue);

  adu_t *in_adus[fec_k];
  unsigned int cnt = 0;

  static long wait_time = 0;
  unsigned long fec_time = 0;
  unsigned long fec_time2 = 0;

  /*M
    Get start time.
  **/
  struct timeval tv;
  gettimeofday(&tv, NULL);
  unsigned long start_sec, start_usec;
  start_sec = tv.tv_sec;
  start_usec = tv.tv_usec;
  
  /*M
    Get next MP3 frame and queue it into the ADU queue.
  **/
  mp3_frame_t mp3_frame;
  while ((mp3_next_frame(&mp3_file, &mp3_frame) > 0) && !finished) {
    if (aq_add_frame(&adu_queue, &mp3_frame) > 0) {
      /* a new ADU has been produced */
      in_adus[cnt] = aq_get_adu(&adu_queue);
      assert(in_adus[cnt] != NULL);

      /* check if the FEC group is complete */
      if (++cnt == fec_k) {
        unsigned int max_len = 0;
        unsigned long group_duration = 0;

        int i;
        for (i = 0; i < fec_k; i++) {
          unsigned int adu_len = mp3_frame_size(in_adus[i]);

          if (adu_len > max_len)
            max_len = adu_len;

          group_duration += in_adus[i]->usec;
        }

        fec_time += group_duration;

        assert(max_len < FEC_PKT_PAYLOAD_SIZE);

        /* Encode the FEC group */
        unsigned char *in_ptrs[fec_k];
        unsigned char buf[fec_k * max_len];
        unsigned char *ptr = buf;
        unsigned long bitrate = 0;
        for (i = 0; i < fec_k; i++) {
          unsigned int adu_len = mp3_frame_size(in_adus[i]);

          in_ptrs[i] = ptr;
          memcpy(ptr, in_adus[i]->raw, adu_len);
          if (adu_len < max_len)
            memset(ptr + adu_len, 0, max_len - adu_len);
          ptr += max_len;
          bitrate += in_adus[i]->bitrate;
        }
        bitrate /= fec_k;

        for (i = 0; i < fec_n; i++) {
          pkt.hdr.packet_seq = i;
          pkt.hdr.fec_k = fec_k;
          pkt.hdr.fec_n = fec_n;
          pkt.hdr.fec_len = max_len + 2;
          pkt.hdr.group_tstamp = fec_time;
          
          fec_encode(fec, in_ptrs, pkt.payload, i, max_len);

          if (i < fec_k) {
            pkt.hdr.len = mp3_frame_size(in_adus[i]);
          } else {
            pkt.hdr.len = max_len;
          }

          /*M
            Simulate packet loss.
          **/
#ifdef DEBUG_PLOSS
          if ((random() % 100) >= ploss_rate ) {
#endif /* DEBUG_PLOSS */

#ifdef DEBUG
            fprintf(stderr,
                    "sending fec packet group stamp %ld, gseq %d, pseq %d, size %d\n",
                    pkt.hdr.group_tstamp, pkt.hdr.group_seq, pkt.hdr.packet_seq, pkt.hdr.len);
#endif
            
            /* send rtp packet */
            if (fec_pkt_sendto(&pkt, sock, (struct sockaddr *)saddr, sizeof(*saddr)) < 0) {
              if (errno == ENOBUFS) {
		fprintf(stderr, "Output buffers full, waiting...\n");
	      } else {
                perror("Error while sending packet");
                
                retval = 0;
                goto exit;
              }
            }
#ifdef DEBUG_PLOSS
          }
#endif /* DEBUG_PLOSS */

          /*M
            Update the time we have to wait.
          **/
          wait_time += (group_duration / fec_n);
          fec_time2 += (group_duration / fec_n);

          /*M
            Sender synchronisation (\verb|sleep| until the next
            packet has to be sent.
          **/
          if (wait_time > 1000)
            usleep(wait_time);

          if (!quiet) {        
            static unsigned int count = 0;
            if ((count++ % 10) == 0) {
              if (mp3_file.size > 0) {
                fprintf(stdout,
                        "\r%02ld:%02ld/%02ld:%02ld %7ld/%7ld %3ldkbit/s (%3ld%%) ",
                        (fec_time2/1000000) / 60,
                        (fec_time2/1000000) % 60,
                        
                        (long)((float)(fec_time/1000) / 
                         ((float)mp3_file.offset+1) * (float)mp3_file.size) / 
                        60000,
                        (long)((float)(fec_time/1000) / 
                         ((float)mp3_file.offset+1) * (float)mp3_file.size) / 
                        1000 % 60,
                        
                        mp3_file.offset,
                        mp3_file.size,

                        bitrate,
                        
                        (long)(100*(float)mp3_file.offset/(float)mp3_file.size));
              } else {
                fprintf(stdout, "\r%02ld:%02ld %ld %3ldkbit/s ",
                        (fec_time2/1000000) / 60,
                        (fec_time2/1000000) % 60,
                        mp3_file.offset,
                        bitrate);
              }
              fflush(stdout);
            }
          }
          
          /*M
            Get length of iteration.
          **/
          gettimeofday(&tv, NULL);
          unsigned long len =
            (tv.tv_sec - start_sec) * 1000000 + (tv.tv_usec - start_usec);
          
          wait_time -= len;
          if (abs(wait_time) > MAX_WAIT_TIME)
            wait_time = 0;

          start_sec = tv.tv_sec;
          start_usec = tv.tv_usec;
        }

        pkt.hdr.group_seq++;

        for (i = 0; i < fec_k; i++)
          free(in_adus[i]);

        cnt = 0;
      }
    }
  }

  int i;
 exit:
  for (i = 0; i < cnt; i++)
    free(in_adus[i]);
  
  aq_destroy(&adu_queue);
  fec_free(fec);

  file_close(&mp3_file);

  return retval;
}

/*M
  \emph{Print usage information.}
**/
static void usage(void) {
  fprintf(stderr,
          "Usage: ./poc-fec [-s address] [-p port] [-k fec_k] [-n fec_n] [-q] [-t ttl]");
#ifdef WITH_IPV6
  fprintf(stderr, " [-6]");
#endif /* WITH_IPV6 */
  fprintf(stderr, " files...\n");
  fprintf(stderr, "\t-s address : destination address (default 224.0.1.23 or ff02::4)\n");
  fprintf(stderr, "\t-p port    : destination port (default 1500)\n");
  fprintf(stderr, "\t-q         : quiet\n");
  fprintf(stderr, "\t-t ttl     : multicast ttl (default 1)\n");
  fprintf(stderr, "\t-k fec_k   : FEC k parameter (default 20)\n");
  fprintf(stderr, "\t-n fec_n   : FEC n parameter (default 25)\n");
#ifdef WITH_IPV6
  fprintf(stderr, "\t-6         : use ipv6\n");
#endif /* WITH_IPV6 */
}

/*M
  \emph{Main server routine.}

  Calls the mainloop for each filename given on the command line.
**/
int main(int argc, char *argv[]) {
  int retval = 0;

  char           *address = NULL;
  unsigned short port     = 1500;
  unsigned int   ttl      = 1;

  /*M
    Process the command line arguments.
  **/
  int c;
  while ((c = getopt(argc, argv, "hs:p:t:qP:k:n:"
#ifdef WITH_IPV6
                     "6"
#endif /* WITH_IPV6 */
                     )) >= 0) {
    switch (c) {
#ifdef WITH_IPV6
    case '6':
      use_ipv6 = 1;
      break;
#endif /* WITH_IPV6 */
      
    case 's':
      if (address != NULL)
        free(address);

      address = strdup(optarg);
      break;

    case 'p':
      port = (unsigned short)atoi(optarg);
      break;

    case 'q':
      quiet = 1;
      break;

    case 't':
      ttl = (unsigned int)atoi(optarg);
      break;

    case 'k':
      fec_k = (unsigned int)atoi(optarg);
      break;

    case 'n':
      fec_n = (unsigned int)atoi(optarg);
      break;
      
#ifdef DEBUG_PLOSS
    case 'P':
      {
        static struct timeval tv;
        gettimeofday(&tv, NULL);
        srandom(tv.tv_sec);
        ploss_rate = atoi(optarg);
        break;
      }
#endif /* DEBUG_PLOSS */

    case 'h':
    default:
      usage();
      retval = EXIT_FAILURE;
      goto exit;
    }
  }

  if (fec_n <= fec_k) {
    fprintf(stderr, "fec_n must be bigger than fec_k\n");
    retval = EXIT_FAILURE;
    goto exit;
  }

  if (optind == argc) {
    usage();
    retval = EXIT_FAILURE;
    goto exit;
  }

  if (address == NULL) {
#ifdef WITH_IPV6
    if (use_ipv6)
      address = strdup("ff02::4");
    else
      address = strdup("224.0.1.23");
#else
    address = strdup("224.0.1.23");
#endif /* WITH_IPV6 */
  }

  if (sig_set_handler(SIGINT, sig_int) == SIG_ERR) {
    retval = EXIT_FAILURE;
    goto exit;
  }

  /*M
    Open the sending socket.
  **/
  int sock;
  struct sockaddr_in saddr;
  if (!net_ip4_resolve_hostname(address, port, NULL, &saddr)) {
    fprintf(stderr, "Could not resolve %s\n", address);
    retval = EXIT_FAILURE;
    goto exit;
  }

  sock  = net_udp4_socket(&saddr, port, ttl);
  if (sock < 0) {
    fprintf(stderr, "Could not open socket\n");
    retval = EXIT_FAILURE;
    goto exit;
  }

  fec_pkt_init(&pkt);
  
  /*M
    Go through all files given on command line and stream them.
  **/
  int i;
  for (i = optind; (i < argc) && !finished; i++) {
    assert(argv[i] != NULL);
    char filename[MAX_FILENAME];
    strncpy(filename, argv[i], MAX_FILENAME - 1);
    filename[MAX_FILENAME - 1] = '\0';
    
    if (!poc_encoder(sock, &saddr, filename))
      continue;
  }
  
 exit:
  if (address != NULL)
    free(address);
  
  return retval;
}

/*M
 */